

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void helicsEndpointSetDefaultDestination(HelicsEndpoint endpoint,char *dest,HelicsError *err)

{
  Endpoint *this;
  EndpointObject *pEVar1;
  size_t sVar2;
  string_view target;
  
  pEVar1 = anon_unknown.dwarf_8bada::verifyEndpoint(endpoint,err);
  if (pEVar1 != (EndpointObject *)0x0) {
    if (dest == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "The supplied string argument is null and therefore invalid";
      }
    }
    else {
      this = pEVar1->endPtr;
      sVar2 = strlen(dest);
      target._M_str = dest;
      target._M_len = sVar2;
      helics::Endpoint::setDefaultDestination(this,target);
    }
  }
  return;
}

Assistant:

void helicsEndpointSetDefaultDestination(HelicsEndpoint endpoint, const char* dest, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    CHECK_NULL_STRING(dest, void());
    try {
        endObj->endPtr->setDefaultDestination(dest);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}